

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O1

bool __thiscall Network::Address::Ethernet::asText(Ethernet *this,String *textualValue)

{
  int64 iVar1;
  ulong uVar2;
  bool bVar3;
  String a;
  int consumed;
  String rawBytes;
  String local_80;
  String local_70;
  String local_60;
  String local_50;
  String local_40;
  
  Bstrlib::String::String(&local_70," \t\v\f\r\n",7);
  if (local_70.super_tagbstring.slen == 0) {
    Bstrlib::String::String(&local_80,textualValue);
  }
  else {
    Bstrlib::String::String(&local_80,textualValue);
    if (local_70.super_tagbstring.slen != 0) {
      Bstrlib::String::rightTrim(&local_80,&local_70);
      Bstrlib::String::leftTrim(&local_80,&local_70);
    }
  }
  Bstrlib::String::String(&local_40,":");
  Bstrlib::String::String(&local_50,"");
  Bstrlib::String::replacedAll(&local_60,&local_80,&local_40);
  Bstrlib::String::~String(&local_50);
  Bstrlib::String::~String(&local_40);
  Bstrlib::String::~String(&local_80);
  Bstrlib::String::~String(&local_70);
  if ((uint)local_60.super_tagbstring.slen < 0xc) {
    bVar3 = false;
  }
  else {
    bVar3 = false;
    uVar2 = 0;
    do {
      local_70.super_tagbstring.mlen = 0;
      Bstrlib::String::splitAt(&local_80,(int)&local_60);
      iVar1 = Bstrlib::String::parseInt(&local_80,0x10,(int *)&local_70);
      this->address[uVar2] = (uint8)iVar1;
      Bstrlib::String::~String(&local_80);
      if (local_70.super_tagbstring.mlen < 2) break;
      bVar3 = 4 < uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar2 != 6);
  }
  Bstrlib::String::~String(&local_60);
  return bVar3;
}

Assistant:

bool Ethernet::asText(const String & textualValue)
        {
            String rawBytes = textualValue.Trimmed().replacedAll(":", "");
            if ((size_t)rawBytes.getLength() < ArrSz(address) * 2) return false;
            for (size_t i = 0; i < ArrSz(address); i++)
            {
                int consumed = 0;
                address[i] = (uint8)rawBytes.splitAt(2).parseInt(16, &consumed);
                if (consumed < 2) return false;
            }
            return true;
        }